

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

void __thiscall
Lib::
Stack<std::pair<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::TermSpec>_>
::~Stack(Stack<std::pair<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::TermSpec>_>
         *this)

{
  if (this->_stack !=
      (pair<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::InstMatcher::TermSpec>
       *)0x0) {
    Lib::free(this->_stack);
  }
  return;
}

Assistant:

inline ~Stack()
  {
    //The while cycle is completely eliminated by compiler
    //in "-O6 -DVDEBUG=0" mode for types without destructor,
    //so this destructor is constant time.
    C* p=_cursor;
    while(p!=_stack) {
      (--p)->~C();
    }
    if(_stack) {
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }
    else {
      ASS_EQ(_capacity,0);
    }
  }